

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

MinimizeConstraint * __thiscall
Clasp::SharedMinimizeData::attach(SharedMinimizeData *this,Solver *s,OptParams *params,bool addRef)

{
  UncoreMinimize *this_00;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,addRef) != 0) {
    LOCK();
    (this->count_).super___atomic_base<unsigned_int>._M_i =
         (this->count_).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  if ((((uint)*params & 1) == 0) || (this->mode_ == enumerate)) {
    this_00 = (UncoreMinimize *)operator_new(0x48);
    DefaultMinimize::DefaultMinimize((DefaultMinimize *)this_00,this,params);
  }
  else {
    this_00 = (UncoreMinimize *)operator_new(0x108);
    UncoreMinimize::UncoreMinimize(this_00,this,params);
  }
  (*(this_00->super_MinimizeConstraint).super_Constraint._vptr_Constraint[0x12])(this_00,s);
  return &this_00->super_MinimizeConstraint;
}

Assistant:

MinimizeConstraint* SharedMinimizeData::attach(Solver& s, const OptParams& params, bool addRef) {
	if (addRef) this->share();
	MinimizeConstraint* ret;
	if (params.type == OptParams::type_bb || mode() == MinimizeMode_t::enumerate) {
		ret = new DefaultMinimize(this, params);
	}
	else {
		ret = new UncoreMinimize(this, params);
	}
	ret->attach(s);
	return ret;
}